

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O0

shared_ptr<mini_bus::IBaseNotifyToken<void>_> __thiscall
mini_bus::MiniBusClient::notify(MiniBusClient *this,string_view key,string_view value)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  size_type sVar1;
  ostream *__os;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t in_R9;
  string_view command;
  string_view payload;
  shared_ptr<mini_bus::IBaseNotifyToken<void>_> sVar2;
  anon_class_1_0_00000001_for_func local_239;
  undefined1 local_238 [16];
  basic_string_view<char,_std::char_traits<char>_> local_228;
  undefined1 local_218 [24];
  __string_type buf;
  ostringstream local_1b0 [8];
  ostringstream oss;
  MiniBusClient *this_local;
  string_view value_local;
  string_view key_local;
  
  value_local._M_str = key._M_str;
  command._M_len = key._M_len;
  value_local._M_len = in_R9;
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&value_local._M_str);
  __os = std::operator<<((ostream *)local_1b0,(uchar)sVar1);
  __str_00._M_str = (char *)value._M_len;
  __str_00._M_len = (size_t)value_local._M_str;
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)__os,__str_00);
  __str._M_str = (char *)value_local._M_len;
  __str._M_len = (size_t)value._M_str;
  buf.field_2._8_8_ = value._M_str;
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1b0,__str);
  std::__cxx11::ostringstream::str();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_228,"NOTIFY");
  local_238 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_218 + 0x10))
  ;
  command._M_str = (char *)local_228._M_len;
  payload._M_str = local_238._0_8_;
  payload._M_len = (size_t)local_228._M_str;
  send_simple_abi_cxx11_((MiniBusClient *)local_218,command,payload);
  operator>><std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_codehz[P]mini_bus_cpp_include_mini_bus_hpp:547:42)>
            ((mini_bus *)this,
             (shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_218,&local_239);
  std::
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_218);
  std::__cxx11::string::~string((string *)(local_218 + 0x10));
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  sVar2.super___shared_ptr<mini_bus::IBaseNotifyToken<void>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mini_bus::IBaseNotifyToken<void>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mini_bus::IBaseNotifyToken<void>_>)
         sVar2.super___shared_ptr<mini_bus::IBaseNotifyToken<void>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<IBaseNotifyToken<void>> notify(std::string_view key, std::string_view value) {
    std::ostringstream oss;
    oss << (unsigned char) key.length() << key;
    oss << value;
    auto buf = oss.str();
    return send_simple("NOTIFY", buf) >> [](std::optional<std::string> str) { return; };
  }